

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall BufferTest_Clear_Test::TestBody(BufferTest_Clear_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  test_buffer<char> buffer;
  size_t in_stack_ffffffffffffff38;
  basic_buffer<char> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  char *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int line;
  basic_buffer<char> *file;
  Type in_stack_ffffffffffffff6c;
  AssertHelper *in_stack_ffffffffffffff70;
  AssertionResult local_78 [2];
  size_t local_58;
  undefined8 local_50;
  Message *in_stack_ffffffffffffffb8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc0;
  basic_buffer<char> local_28;
  
  file = &local_28;
  test_buffer<char>::test_buffer((test_buffer<char> *)in_stack_ffffffffffffff40);
  fmt::v5::internal::basic_buffer<char>::resize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
  ;
  fmt::v5::internal::basic_buffer<char>::resize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38)
  ;
  local_50 = 0;
  local_58 = fmt::v5::internal::basic_buffer<char>::size(&local_28);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50,
             (unsigned_long *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             (unsigned_long *)in_stack_ffffffffffffff40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffb8);
  line = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff5c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff50 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1201e4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,(char *)file,line,
               in_stack_ffffffffffffff50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffffc0.ptr_,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff40);
    testing::Message::~Message((Message *)0x120232);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x120281);
  fmt::v5::internal::basic_buffer<char>::capacity(&local_28);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((char *)CONCAT44(line,in_stack_ffffffffffffff58),in_stack_ffffffffffffff50,
             (uint *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             (unsigned_long *)in_stack_ffffffffffffff40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12031f)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,(char *)file,line,
               in_stack_ffffffffffffff50);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffffc0.ptr_,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x12036d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1203b9);
  test_buffer<char>::~test_buffer((test_buffer<char> *)0x1203c6);
  return;
}

Assistant:

TEST(BufferTest, Clear) {
  test_buffer<char> buffer;
  buffer.resize(20);
  buffer.resize(0);
  EXPECT_EQ(static_cast<size_t>(0), buffer.size());
  EXPECT_EQ(20u, buffer.capacity());
}